

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImVector_ImFontPtr_resize(ImVector_ImFontPtr *self,int new_size)

{
  ImFont **__dest;
  int iVar1;
  
  iVar1 = self->Capacity;
  if (iVar1 < new_size) {
    if (iVar1 == 0) {
      iVar1 = 8;
    }
    else {
      iVar1 = iVar1 / 2 + iVar1;
    }
    if (iVar1 <= new_size) {
      iVar1 = new_size;
    }
    __dest = (ImFont **)ImGui::MemAlloc((long)iVar1 << 3);
    if (self->Data != (ImFont **)0x0) {
      memcpy(__dest,self->Data,(long)self->Size << 3);
      ImGui::MemFree(self->Data);
    }
    self->Data = __dest;
    self->Capacity = iVar1;
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontPtr_resize(ImVector_ImFontPtr* self,int new_size)
{
    return self->resize(new_size);
}